

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O0

void llvm::format_provider<unsigned_int,_void>::format(uint *V,raw_ostream *Stream,StringRef Style)

{
  uint uVar1;
  raw_ostream *this;
  bool bVar2;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  IntegerStyle local_4c;
  undefined4 uStack_48;
  IntegerStyle IS;
  bool local_40;
  unsigned_long local_38;
  size_t Digits;
  raw_ostream *prStack_28;
  HexPrintStyle HS;
  raw_ostream *Stream_local;
  uint *V_local;
  StringRef Style_local;
  
  Style_local.Data = (char *)Style.Length;
  V_local = (uint *)Style.Data;
  local_38 = 0;
  prStack_28 = Stream;
  Stream_local = (raw_ostream *)V;
  bVar2 = detail::HelperFunctions::consumeHexStyle
                    ((StringRef *)&V_local,(HexPrintStyle *)((long)&Digits + 4));
  if (bVar2) {
    local_38 = detail::HelperFunctions::consumeNumHexDigits((StringRef *)&V_local,Digits._4_4_,0);
    this = prStack_28;
    uVar1 = *(uint *)&Stream_local->_vptr_raw_ostream;
    Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&stack0xffffffffffffffb8,&local_38)
    ;
    Width.Storage.field_0.value._1_7_ = 0;
    Width.Storage.field_0.empty = local_40;
    Width.Storage._8_8_ = in_R9;
    write_hex((llvm *)this,(raw_ostream *)(ulong)uVar1,(ulong)Digits._4_4_,uStack_48,Width);
    return;
  }
  local_4c = Integer;
  StringRef::StringRef(&local_60,"N");
  bVar2 = StringRef::consume_front((StringRef *)&V_local,local_60);
  if (!bVar2) {
    StringRef::StringRef(&local_70,"n");
    bVar2 = StringRef::consume_front((StringRef *)&V_local,local_70);
    if (!bVar2) {
      StringRef::StringRef(&local_80,"D");
      bVar2 = StringRef::consume_front((StringRef *)&V_local,local_80);
      if (!bVar2) {
        StringRef::StringRef(&local_90,"d");
        bVar2 = StringRef::consume_front((StringRef *)&V_local,local_90);
        if (!bVar2) goto LAB_020450f6;
      }
      local_4c = Integer;
      goto LAB_020450f6;
    }
  }
  local_4c = Number;
LAB_020450f6:
  StringRef::consumeInteger<unsigned_long>((StringRef *)&V_local,10,&local_38);
  bVar2 = StringRef::empty((StringRef *)&V_local);
  if (bVar2) {
    write_integer(prStack_28,*(uint *)&Stream_local->_vptr_raw_ostream,local_38,local_4c);
    return;
  }
  __assert_fail("Style.empty() && \"Invalid integral format style!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                ,0x93,
                "static void llvm::format_provider<unsigned int>::format(const T &, llvm::raw_ostream &, StringRef) [T = unsigned int, Enable = void]"
               );
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    HexPrintStyle HS;
    size_t Digits = 0;
    if (consumeHexStyle(Style, HS)) {
      Digits = consumeNumHexDigits(Style, HS, 0);
      write_hex(Stream, V, HS, Digits);
      return;
    }

    IntegerStyle IS = IntegerStyle::Integer;
    if (Style.consume_front("N") || Style.consume_front("n"))
      IS = IntegerStyle::Number;
    else if (Style.consume_front("D") || Style.consume_front("d"))
      IS = IntegerStyle::Integer;

    Style.consumeInteger(10, Digits);
    assert(Style.empty() && "Invalid integral format style!");
    write_integer(Stream, V, Digits, IS);
  }